

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.c
# Opt level: O3

void sysbvm_errorWithMessageTuple(sysbvm_tuple_t message)

{
  sysbvm_context_t *psVar1;
  sysbvm_tuple_t sVar2;
  char *cstring;
  
  cstring = (char *)message;
  psVar1 = sysbvm_stackFrame_getActiveContext();
  if (psVar1 != (sysbvm_context_t *)0x0) {
    sVar2 = sysbvm_error_createWithMessageText(psVar1,message);
    sysbvm_exception_signal(psVar1,sVar2);
    return;
  }
  sysbvm_errorWithMessageTuple_cold_1();
  psVar1 = sysbvm_stackFrame_getActiveContext();
  if (psVar1 != (sysbvm_context_t *)0x0) {
    sVar2 = sysbvm_string_createWithCString(psVar1,cstring);
    sVar2 = sysbvm_error_createWithMessageText(psVar1,sVar2);
    sysbvm_exception_signal(psVar1,sVar2);
    return;
  }
  sysbvm_error_cold_1();
  sysbvm_error("Cannot access slot of dummy value.");
}

Assistant:

SYSBVM_API void sysbvm_errorWithMessageTuple(sysbvm_tuple_t message)
{
    sysbvm_context_t *activeContext = sysbvm_stackFrame_getActiveContext();
    if(!activeContext)
    {
        fprintf(stderr, "Cannot raise error with the specified message.\n");
        abort();
    }

    sysbvm_tuple_t errorException = sysbvm_error_createWithMessageText(activeContext, message);
    sysbvm_exception_signal(activeContext, errorException);
}